

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O2

bool FBaseCVar::ToBool(UCVarValue value,ECVarType type)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  
  switch(type) {
  case CVAR_Bool:
    goto switchD_00427ee3_caseD_0;
  case CVAR_Int:
    bVar3 = value.Int == 0;
    break;
  case CVAR_Float:
    bVar3 = ((ulong)value.String & 0x7fffffff) == 0;
    break;
  case CVAR_String:
    iVar1 = strcasecmp(value.String,"true");
    if (iVar1 == 0) {
      value = (UCVarValue)0x1;
      goto switchD_00427ee3_caseD_0;
    }
    iVar1 = strcasecmp(value.String,"false");
    if (iVar1 == 0) goto switchD_00427ee3_default;
    lVar2 = strtol(value.String,(char **)0x0,0);
    bVar3 = lVar2 == 0;
    break;
  default:
switchD_00427ee3_default:
    value.String = (char *)0x0;
    goto switchD_00427ee3_caseD_0;
  }
  value._1_7_ = 0;
  value.Bool = !bVar3;
switchD_00427ee3_caseD_0:
  return (bool)(value.Bool & 1);
}

Assistant:

bool FBaseCVar::ToBool (UCVarValue value, ECVarType type)
{
	switch (type)
	{
	case CVAR_Bool:
		return value.Bool;

	case CVAR_Int:
		return !!value.Int;

	case CVAR_Float:
		return value.Float != 0.f;

	case CVAR_String:
		if (stricmp (value.String, "true") == 0)
			return true;
		else if (stricmp (value.String, "false") == 0)
			return false;
		else
			return !!strtol (value.String, NULL, 0);

	case CVAR_GUID:
		return false;

	default:
		return false;
	}
}